

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  time_measure t1;
  time_measure t0;
  undefined8 *in_RSI;
  undefined4 in_EDI;
  float_type fVar1;
  undefined1 auVar2 [16];
  time_measure endTime;
  time_measure startTime;
  float_type stop_time;
  fdtd fdtd;
  uint initialize_setup_id;
  int optchar;
  int sscanf_return;
  _Bool verbose;
  size_t num_iterations;
  float_type end_time;
  uint setup_id;
  uint dimension;
  uint border_cpml_width;
  float_type smallest_wavelength;
  float_type Sc;
  char *output_filename;
  float_type domain_size [3];
  fdtd *in_stack_fffffffffffffd38;
  fdtd *in_stack_fffffffffffffd40;
  fdtd *fdtd_00;
  double in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  int iVar3;
  float_type *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  uint in_stack_fffffffffffffd64;
  timespec local_290;
  double local_280;
  uint local_90;
  uint local_8c;
  int local_88;
  undefined1 local_81;
  undefined8 local_80;
  double local_78;
  uint local_6c;
  int local_68;
  undefined4 local_64;
  double local_60;
  double local_58;
  char *local_50;
  double local_48;
  double local_40;
  double local_38;
  undefined8 *local_30;
  undefined4 local_28;
  undefined4 local_24;
  undefined8 local_20;
  undefined8 local_18;
  timespec *local_10;
  timespec *local_8;
  
  local_24 = 0;
  local_48 = 1e-05;
  local_40 = 1e-05;
  local_38 = 1e-05;
  local_50 = (char *)0x0;
  local_58 = -1.0;
  local_60 = 4.5e-07;
  local_64 = 0x14;
  local_68 = 1;
  local_6c = 0;
  local_78 = -1.0;
  local_80 = 400;
  local_81 = 1;
  local_30 = in_RSI;
  local_28 = in_EDI;
  while (local_8c = getopt_long(local_28,local_30,":123s:x:y:z:o:c:w:a:t:i:hq",opt_options,0),
        local_8c != 0xffffffff) {
    in_stack_fffffffffffffd58 = (float_type *)(ulong)(local_8c - 0x31);
    if (local_8c - 0x31 < 0x49 || local_8c == 0x7a) {
      switch((long)&switchD_0010136c::switchdataD_00112040 +
             (long)(int)(&switchD_0010136c::switchdataD_00112040)[(long)in_stack_fffffffffffffd58])
      {
      case 0x10136e:
        local_68 = 1;
        break;
      case 0x10137e:
        local_68 = 2;
        break;
      case 0x10138e:
        local_68 = 3;
        break;
      case 0x10139e:
        if (((_optarg == (char *)0x0) || (*_optarg == '-')) || (*_optarg == '\0')) {
          local_50 = "gridData.dat";
          if (_optarg != (char *)0x0) {
            _optind = _optind + -1;
          }
        }
        else {
          local_50 = _optarg;
        }
        break;
      case 0x10141b:
        local_81 = 0;
        break;
      case 0x101428:
        local_88 = __isoc99_sscanf(_optarg,"%lf",&local_48);
        if (((local_88 == -1) || (local_88 == 0)) || (local_48 < 0.0)) {
          fprintf(_stderr,
                  "Please enter a positive floating point number for the domain size instead of \"-%c %s\"\n"
                  ,(ulong)local_8c,_optarg);
          local_48 = 1e-05;
        }
        break;
      case 0x1014b1:
        local_88 = __isoc99_sscanf(_optarg,"%lf",&local_40);
        if (((local_88 == -1) || (local_88 == 0)) || (local_40 < 0.0)) {
          fprintf(_stderr,
                  "Please enter a positive floating point number for the domain size instead of \"-%c %s\"\n"
                  ,(ulong)local_8c,_optarg);
          local_40 = 1e-05;
        }
        break;
      case 0x10153e:
        local_88 = __isoc99_sscanf(_optarg,"%lf",&local_38);
        if (((local_88 == -1) || (local_88 == 0)) || (local_38 < 0.0)) {
          fprintf(_stderr,
                  "Please enter a positive floating point number for the domain size instead of \"-%c %s\"\n"
                  ,(ulong)local_8c,_optarg);
          local_38 = 1e-05;
        }
        break;
      case 0x1015cb:
        local_88 = __isoc99_sscanf(_optarg,"%u",&local_64);
        if ((local_88 == -1) || (local_88 == 0)) {
          fprintf(_stderr,
                  "Please enter a positive integer for the cpml thickness instead of \"-%c %s\"\n",
                  (ulong)local_8c,_optarg);
          local_64 = 0x14;
        }
        break;
      case 0x10163f:
        local_88 = __isoc99_sscanf(_optarg,"%u",&local_6c);
        if ((local_88 == -1) || (local_88 == 0)) {
          fprintf(_stderr,"Please enter a positive integer for the setup id instead of \"-%c %s\"\n"
                  ,(ulong)local_8c,_optarg);
          local_6c = 0;
        }
        break;
      case 0x1016b3:
        local_88 = __isoc99_sscanf(_optarg,"%zu",&local_80);
        if ((local_88 == -1) || (local_88 == 0)) {
          fprintf(_stderr,
                  "Please enter a positive integer for the number of iterations instead of \"-%c %s\"\n"
                  ,(ulong)local_8c,_optarg);
          local_80 = 0;
        }
        break;
      case 0x101728:
        local_88 = __isoc99_sscanf(_optarg,"%lf",&local_58);
        if (((local_88 == -1) || (local_88 == 0)) || (local_58 < 0.0)) {
          fprintf(_stderr,
                  "Please enter a positive floating point number for the Courant-Friedrichs-Levy stability value instead of \"-%c %s\"\n"
                  ,(ulong)local_8c,_optarg);
          local_58 = -1.0;
        }
        break;
      case 0x1017b1:
        local_88 = __isoc99_sscanf(_optarg,"%lf",&local_78);
        if (((local_88 == -1) || (local_88 == 0)) || (local_78 < 0.0)) {
          fprintf(_stderr,
                  "Please enter a positive floating point number for the simulation end time instead of \"-%c %s\"\n"
                  ,(ulong)local_8c,_optarg);
          local_78 = -1.0;
        }
        break;
      case 0x10183a:
        local_88 = __isoc99_sscanf(_optarg,"%lf",&local_60);
        if (((local_88 == -1) || (local_88 == 0)) || (local_60 < 0.0)) {
          fprintf(_stderr,
                  "Please enter a positive floating point number for the Courant-Friedrichs-Levy stability value instead of \"-%c %s\"\n"
                  ,(ulong)local_8c,_optarg);
          local_60 = 4.5e-07;
        }
        break;
      case 0x1018c0:
        printf("Usage: %s <options>\n%s\n",*local_30,
               "Options:\n  -1 --one-dimensional     : 1D solver\n  -2 --one-dimensional     : 2D solver\n  -3 --one-dimensional     : 3D solver\n  -s --setup-id            : Predefined problem identifier\n                             1D : 0 - Half air half water, left-to-right gaussian\n                             2D : 0 - West air east water, west-to-east gaussian\n                                  1 - Air with high permittivity centered object, west pulse\n                                  2 - Centered gaussian excitation in free space\n                             3D : 0 - Half air half water, west-to-east gaussian\n                                  1 - Air with high permittivity centered object\n  -x --size-x              : Size of the domain (e.g. 0.00001)\n  -y --size-y              : Size of the domain (e.g. 0.00001)\n  -z --size-z              : Size of the domain (e.g. 0.00001)\n  -o --output              : Select the output file name\n  -c --courant-friedrichs-levy-condition : Stability value\n  -w --smallest-wavelength : Smallest wavelength in the simulation\n  -a --cpml-absorbing-thickness  : Size of the absorbing boundary wall\n  -t --stop-sim-time       : Stop the simulation when the time is reached\n  -i --num-iterations      : Stop the simulation after the specified amount of solver iterations\n  -h --help                : Print this help\n  -q --quiet               : Do not print information to the user from inside the main kernel"
              );
        return 0;
      }
    }
  }
  iVar3 = local_68;
  if (local_68 == 1) {
    if (local_6c != 0) {
      fprintf(_stderr,"The input setup id %u does not map to any available 1D setup\n",
              (ulong)local_6c);
      exit(1);
    }
    local_90 = local_6c;
    if ((local_58 == -1.0) && (!NAN(local_58))) {
      local_58 = 1.0;
    }
  }
  else if (local_68 == 2) {
    if (2 < local_6c) {
      fprintf(_stderr,"The input setup id %u does not map to any available 2D setup\n",
              (ulong)local_6c);
      exit(1);
    }
    local_90 = local_6c + 2;
    if ((local_58 == -1.0) && (!NAN(local_58))) {
      local_18 = 0x4008000000000000;
      local_58 = sqrt(3.0);
      local_58 = 1.0 / local_58;
    }
  }
  else if (local_68 == 3) {
    if (1 < local_6c) {
      fprintf(_stderr,"The input setup id %u does not map to any available 3D setup\n",
              (ulong)local_6c);
      exit(1);
    }
    local_90 = local_6c + 6;
    if ((local_58 == -1.0) && (!NAN(local_58))) {
      local_20 = 0x4010000000000000;
      local_58 = sqrt(4.0);
      local_58 = 1.0 / local_58;
    }
  }
  initializeFdtd_cmpl(in_stack_fffffffffffffd64,in_stack_fffffffffffffd58,
                      (float_type)CONCAT44(iVar3,in_stack_fffffffffffffd50),
                      in_stack_fffffffffffffd48,(uintmax_t)in_stack_fffffffffffffd40);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_78;
  if (local_78 <= 0.0) {
    auVar2 = vcvtusi2sd_avx512f(auVar2,local_80);
    in_stack_fffffffffffffd48 = auVar2._0_8_;
    fVar1 = get_time_step_fdtd(in_stack_fffffffffffffd38);
    local_280 = in_stack_fffffffffffffd48 * fVar1;
  }
  else {
    local_280 = local_78;
  }
  local_8 = &local_290;
  clock_gettime(4,local_8);
  run_fdtd(in_stack_fffffffffffffd40,(float_type)in_stack_fffffffffffffd38,false);
  local_10 = (timespec *)&stack0xfffffffffffffd60;
  clock_gettime(4,local_10);
  t0.tv_nsec._0_4_ = in_stack_fffffffffffffd60;
  t0.tv_sec = (__time_t)in_stack_fffffffffffffd58;
  t0.tv_nsec._4_4_ = in_stack_fffffffffffffd64;
  t1.tv_nsec._0_4_ = in_stack_fffffffffffffd50;
  t1.tv_sec = (__time_t)in_stack_fffffffffffffd48;
  t1.tv_nsec._4_4_ = iVar3;
  fdtd_00 = _stdout;
  measuring_difftime(t0,t1);
  fprintf((FILE *)fdtd_00,"Kernel time %.4fs\n");
  if (local_50 != (char *)0x0) {
    dump_fdtd(fdtd_00,(char *)in_stack_fffffffffffffd38,dump_ex);
  }
  free_fdtd(fdtd_00);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  float_type domain_size[3] = {default_domain_size, default_domain_size,
                               default_domain_size};
  char *output_filename = NULL;
  float_type Sc = default_Sc;
  float_type smallest_wavelength = default_smallest_wavelength;
  unsigned border_cpml_width = default_cpml_width;
  unsigned dimension = 1;
  unsigned setup_id = 0; // Default to the first one for each the dimension
  float_type end_time = default_end_time;
  size_t num_iterations = default_iteration_count;
  bool verbose = true;

  while (true) {
    int sscanf_return;
    int optchar = getopt_long(argc, argv, options, opt_options, NULL);
    if (optchar == -1)
      break;
    switch (optchar) {
    case '1':
      dimension = 1;
      break;
    case '2':
      dimension = 2;
      break;
    case '3':
      dimension = 3;
      break;
    case 'o':
      if (optarg != NULL && optarg[0] != '-' && optarg[0] != '\0') {
        output_filename = optarg;
      } else {
        output_filename = "gridData.dat";
        if (optarg != NULL)
          optind--;
      }
      break;
    case 'q':
      verbose = false;
      break;
    case 'x':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &domain_size[0]);
#else
      sscanf_return = sscanf(optarg, "%f", &domain_size[0]);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 ||
          domain_size[0] < float_cst(0.)) {
        fprintf(stderr,
                "Please enter a positive floating point number for the domain "
                "size instead of \"-%c %s\"\n",
                optchar, optarg);
        domain_size[0] = default_domain_size;
      }
      break;
    case 'y':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &domain_size[1]);
#else
      sscanf_return = sscanf(optarg, "%f", &domain_size[1]);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 ||
          domain_size[1] < float_cst(0.)) {
        fprintf(stderr,
                "Please enter a positive floating point number for the domain "
                "size instead of \"-%c %s\"\n",
                optchar, optarg);
        domain_size[1] = default_domain_size;
      }
      break;
    case 'z':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &domain_size[2]);
#else
      sscanf_return = sscanf(optarg, "%f", &domain_size[2]);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 ||
          domain_size[2] < float_cst(0.)) {
        fprintf(stderr,
                "Please enter a positive floating point number for the domain "
                "size instead of \"-%c %s\"\n",
                optchar, optarg);
        domain_size[2] = default_domain_size;
      }
      break;
    case 'a':
      sscanf_return = sscanf(optarg, "%u", &border_cpml_width);
      if (sscanf_return == EOF || sscanf_return == 0) {
        fprintf(stderr,
                "Please enter a positive integer for the cpml thickness "
                "instead of \"-%c %s\"\n",
                optchar, optarg);
        border_cpml_width = default_cpml_width;
      }
      break;
    case 's':
      sscanf_return = sscanf(optarg, "%u", &setup_id);
      if (sscanf_return == EOF || sscanf_return == 0) {
        fprintf(stderr,
                "Please enter a positive integer for the setup id instead of "
                "\"-%c %s\"\n",
                optchar, optarg);
        setup_id = 0;
      }
      break;
    case 'i':
      sscanf_return = sscanf(optarg, "%zu", &num_iterations);
      if (sscanf_return == EOF || sscanf_return == 0) {
        fprintf(stderr,
                "Please enter a positive integer for the number of iterations "
                "instead of "
                "\"-%c %s\"\n",
                optchar, optarg);
        num_iterations = 0;
      }
      break;
    case 'c':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &Sc);
#else
      sscanf_return = sscanf(optarg, "%f", &Sc);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 || Sc < float_cst(0.)) {
        fprintf(
            stderr,
            "Please enter a positive floating point number for the "
            "Courant-Friedrichs-Levy stability value instead of \"-%c %s\"\n",
            optchar, optarg);
        Sc = default_Sc;
      }
      break;
    case 't':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &end_time);
#else
      sscanf_return = sscanf(optarg, "%f", &end_time);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 ||
          end_time < float_cst(0.)) {
        fprintf(stderr,
                "Please enter a positive floating point number for the "
                "simulation end time instead of \"-%c %s\"\n",
                optchar, optarg);
        end_time = default_end_time;
      }
      break;
    case 'w':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &smallest_wavelength);
#else
      sscanf_return = sscanf(optarg, "%f", &smallest_wavelength);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 ||
          smallest_wavelength < float_cst(0.)) {
        fprintf(
            stderr,
            "Please enter a positive floating point number for the "
            "Courant-Friedrichs-Levy stability value instead of \"-%c %s\"\n",
            optchar, optarg);
        smallest_wavelength = default_smallest_wavelength;
      }
      break;
    case 'h':
      printf("Usage: %s <options>\n%s\n", argv[0], help_string);
      return EXIT_SUCCESS;
    }
  }

  unsigned initialize_setup_id;
  switch (dimension) {
  case 1: {
    if (setup_id >= last_1D_setup) {
      fprintf(stderr,
              "The input setup id %u does not map to any available 1D setup\n",
              setup_id);
      exit(EXIT_FAILURE);
    }
    initialize_setup_id = setup_id;
    if (Sc == default_Sc) {
      Sc = float_cst(1.);
    }
  } break;
  case 2: {
    if (setup_id >= last_2D_setup - last_1D_setup - 1) {
      fprintf(stderr,
              "The input setup id %u does not map to any available 2D setup\n",
              setup_id);
      exit(EXIT_FAILURE);
    }
    initialize_setup_id = setup_id + last_1D_setup + 1;
    if (Sc == default_Sc) {
      Sc = float_cst(1.) / sqrt(float_cst(3.));
    }
  } break;
  case 3: {
    if (setup_id >= last_3D_setup - last_2D_setup - 1) {
      fprintf(stderr,
              "The input setup id %u does not map to any available 3D setup\n",
              setup_id);
      exit(EXIT_FAILURE);
    }
    initialize_setup_id = setup_id + last_2D_setup + 1;
    if (Sc == default_Sc) {
      Sc = float_cst(1.) / sqrt(float_cst(4.));
    }
  } break;
  }

  struct fdtd fdtd =
      initializeFdtd_cmpl(initialize_setup_id, domain_size, Sc,
                          smallest_wavelength, border_cpml_width);

  float_type stop_time;
  if (end_time > float_cst(0.)) {
    stop_time = end_time;
  } else {
    stop_time = (float_type)num_iterations * get_time_step_fdtd(&fdtd);
  }
  time_measure startTime, endTime;
  get_current_time(&startTime);
  run_fdtd(&fdtd, stop_time, verbose);
  get_current_time(&endTime);
  fprintf(stdout, "Kernel time %.4fs\n",
          measuring_difftime(startTime, endTime));
  if (output_filename) {
    dump_fdtd(&fdtd, output_filename, dump_ez);
  }
  free_fdtd(&fdtd);

  return EXIT_SUCCESS;
}